

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,mbedtls_mpi *Y,uchar swap)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  mbedtls_mpi_uint mVar5;
  mbedtls_mpi_uint mVar6;
  
  if (X != Y) {
    iVar2 = mbedtls_mpi_grow(X,Y->n);
    if (iVar2 == 0) {
      iVar2 = mbedtls_mpi_grow(Y,X->n);
      if (iVar2 == 0) {
        iVar2 = X->s;
        iVar3 = Y->s;
        if (swap == '\0') {
          iVar3 = iVar2;
        }
        X->s = iVar3;
        if (swap == '\0') {
          iVar2 = Y->s;
        }
        Y->s = iVar2;
        iVar2 = 0;
        for (uVar4 = 0; uVar4 < X->n; uVar4 = uVar4 + 1) {
          mVar5 = X->p[uVar4];
          pmVar1 = Y->p;
          mVar6 = pmVar1[uVar4];
          if (swap == '\0') {
            mVar6 = mVar5;
          }
          X->p[uVar4] = mVar6;
          if (swap == '\0') {
            mVar5 = pmVar1[uVar4];
          }
          pmVar1[uVar4] = mVar5;
        }
      }
    }
    return iVar2;
  }
  return 0;
}

Assistant:

int mbedtls_mpi_safe_cond_swap( mbedtls_mpi *X, mbedtls_mpi *Y, unsigned char swap )
{
    int ret, s;
    size_t i;
    mbedtls_mpi_uint tmp;

    if( X == Y )
        return( 0 );

    /* make sure swap is 0 or 1 in a time-constant manner */
    swap = (swap | (unsigned char)-swap) >> 7;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, Y->n ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( Y, X->n ) );

    s = X->s;
    X->s = X->s * ( 1 - swap ) + Y->s * swap;
    Y->s = Y->s * ( 1 - swap ) +    s * swap;


    for( i = 0; i < X->n; i++ )
    {
        tmp = X->p[i];
        X->p[i] = X->p[i] * ( 1 - swap ) + Y->p[i] * swap;
        Y->p[i] = Y->p[i] * ( 1 - swap ) +     tmp * swap;
    }

cleanup:
    return( ret );
}